

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsort.cpp
# Opt level: O0

void __thiscall CVmQSortData::sort(CVmQSortData *this,size_t l,size_t r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  CVmQSortData *in_RDX;
  CVmQSortData *in_RSI;
  long *in_RDI;
  bool bVar4;
  size_t v_idx;
  int j;
  int i;
  undefined8 local_28;
  
  if (in_RSI < in_RDX) {
    iVar1 = (int)in_RSI + -1;
    iVar3 = (int)in_RDX;
    local_28 = in_RDX;
    do {
      do {
        iVar1 = iVar1 + 1;
        bVar4 = false;
        if (iVar1 != (int)in_RDX) {
          iVar2 = (**(code **)*in_RDI)(in_RDI,(long)iVar1,local_28);
          bVar4 = iVar2 < 0;
        }
      } while (bVar4);
      do {
        iVar3 = iVar3 + -1;
        bVar4 = false;
        if (iVar3 != (int)in_RSI) {
          iVar2 = (**(code **)*in_RDI)(in_RDI,(long)iVar3,local_28);
          bVar4 = 0 < iVar2;
        }
      } while (bVar4);
      (**(code **)(*in_RDI + 8))(in_RDI,(long)iVar1,(long)iVar3);
      if ((int)local_28 == iVar1) {
        local_28 = (CVmQSortData *)(long)iVar3;
      }
      else if ((int)local_28 == iVar3) {
        local_28 = (CVmQSortData *)(long)iVar1;
      }
    } while (iVar1 < iVar3);
    (**(code **)(*in_RDI + 8))(in_RDI,(long)iVar1,(long)iVar3);
    (**(code **)(*in_RDI + 8))(in_RDI,(long)iVar1,in_RDX);
    if ((int)in_RSI < iVar1) {
      sort(in_RSI,(size_t)in_RDX,CONCAT44(iVar1,iVar3));
    }
    if (iVar1 < (int)in_RDX) {
      sort(in_RSI,(size_t)in_RDX,CONCAT44(iVar1,iVar3));
    }
  }
  return;
}

Assistant:

void CVmQSortData::sort(VMG_ size_t l, size_t r)
{
    /* proceed if we have a non-empty range */
    if (r > l)
    {
        int i, j;
        size_t v_idx = r;

        /* start at the ends of the range */
		i = (int)l - 1;
        j = r;

        /* partition the range */
        do
        {
            /* find the leftmost element >= the right element */
            do
            {
                ++i;
			} while (i != (int)r && compare(vmg_ i, v_idx) < 0);

            /* find the rightmost element <= the right element */
            do
            {
                --j;
			} while (j != (int)l && compare(vmg_ j, v_idx) > 0);

            /* exchange elements i and j */
            exchange(vmg_ i, j);

            /* if we moved the 'v' element, follow that in the index */
			if ((int)v_idx == i)
                v_idx = j;
			else if ((int)v_idx == j)
                v_idx = i;

        } while (j > i);

        /* undo the last exchange */
        exchange(vmg_ i, j);

        /* exchange the right value into the pivot point */
        exchange(vmg_ i, r);

        /* recursively sort the subranges */
		if (i > (int)l)
            sort(vmg_ l, i - 1);
		if (i < (int)r)
            sort(vmg_ i + 1, r);
    }
}